

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>::
deserialize(BasicTypeInfo<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_>
            *this,Deserializer *d,void *ptr)

{
  bool bVar1;
  
  bVar1 = Deserializer::deserialize<dap::SourceBreakpoint>(d,(array<dap::SourceBreakpoint> *)ptr);
  return bVar1;
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }